

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O3

void __thiscall
cornerstone::raft_server::handle_append_entries_resp(raft_server *this,resp_msg *resp)

{
  mutex *__mutex;
  peer *p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  int iVar7;
  iterator iVar8;
  size_t sVar9;
  undefined4 extraout_var;
  ulong uVar10;
  undefined4 extraout_var_00;
  pointer puVar11;
  pointer puVar12;
  bool bVar13;
  bool bVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> matched_indexes;
  long *local_c0 [2];
  long local_b0 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0 [4];
  char *local_38;
  
  std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base);
  local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (resp->super_msg_base).src_;
  iVar8 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->peers_)._M_h,(key_type_conflict *)local_a0);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38 = "the response is from an unkonw peer %d";
    snprintf((char *)local_a0,100,"the response is from an unkonw peer %d",
             (ulong)(uint)(resp->super_msg_base).src_);
    local_c0[0] = local_b0;
    sVar9 = strlen((char *)local_a0);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,local_a0,
               (long)&local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + sVar9);
    (*peVar1->_vptr_logger[3])(peVar1,local_c0);
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
  }
  else {
    p = *(peer **)((long)iVar8.
                         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                         ._M_cur + 0x10);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)iVar8.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
                      ._M_cur + 0x18);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    bVar13 = resp->accepted_;
    __mutex = &p->lock_;
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (bVar13 == true) {
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      uVar2 = resp->next_idx_;
      p->next_log_idx_ = uVar2;
      p->matched_idx_ = uVar2 - 1;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (local_a0,(this->peers_)._M_h._M_element_count + 1,(allocator_type *)local_c0);
      iVar7 = (*((this->log_store_).
                 super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      puVar12 = (pointer)CONCAT44(local_a0[0].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int32)local_a0[0].
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
      *puVar12 = CONCAT44(extraout_var,iVar7) - 1;
      puVar11 = puVar12;
      for (p_Var3 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
          p_Var3 = p_Var3->_M_nxt) {
        puVar11 = puVar11 + 1;
        *puVar11 = (unsigned_long)p_Var3[2]._M_nxt[9]._M_nxt;
      }
      if (puVar12 !=
          local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar10 = (long)local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3;
        lVar5 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                  (puVar12,local_a0[0].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                  (puVar12,local_a0[0].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
        puVar12 = (pointer)CONCAT44(local_a0[0].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int32)local_a0[0].
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
      }
      commit(this,*(ulong *)((long)puVar12 +
                            ((this->peers_)._M_h._M_element_count * 4 + 4 & 0xfffffffffffffff8)));
      bVar13 = false;
      LOCK();
      bVar14 = (p->pending_commit_flag_)._M_base._M_i == true;
      if (bVar14) {
        (p->pending_commit_flag_)._M_base._M_i = false;
      }
      UNLOCK();
      if (!bVar14) {
        uVar10 = resp->next_idx_;
        iVar7 = (*((this->log_store_).
                   super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        bVar13 = CONCAT44(extraout_var_00,iVar7) <= uVar10;
      }
      pvVar6 = (void *)CONCAT44(local_a0[0].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int32)local_a0[0].
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_a0[0].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar6);
      }
    }
    else {
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      uVar10 = resp->next_idx_;
      uVar4 = p->next_log_idx_;
      if ((uVar10 == 0) || (uVar4 <= uVar10)) {
        if (uVar4 != 0) {
          p->next_log_idx_ = uVar4 - 1;
        }
      }
      else {
        p->next_log_idx_ = uVar10;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      bVar13 = false;
    }
    if ((!bVar13) && (this->role_ == leader)) {
      request_append_entries(this,p);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
  return;
}

Assistant:

void raft_server::handle_append_entries_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        {
            auto_lock(p->get_lock());
            p->set_next_log_idx(resp.get_next_idx());
            p->set_matched_idx(resp.get_next_idx() - 1);
        }

        // try to commit with this response
        std::vector<ulong> matched_indexes(peers_.size() + 1);
        matched_indexes[0] = log_store_->next_slot() - 1;
        int i = 1;
        for (it = peers_.begin(); it != peers_.end(); ++it, i++)
        {
            matched_indexes[i] = it->second->get_matched_idx();
        }

        std::sort(matched_indexes.begin(), matched_indexes.end(), std::greater<ulong>());
        commit(matched_indexes[(peers_.size() + 1) / 2]);
        need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
    }
    else
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        if (resp.get_next_idx() > 0 && p->get_next_log_idx() > resp.get_next_idx())
        {
            // fast move for the peer to catch up
            p->set_next_log_idx(resp.get_next_idx());
        }
        else if (p->get_next_log_idx() > 0)
        {
            p->set_next_log_idx(p->get_next_log_idx() - 1);
        }
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}